

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void density::
     heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
     ::cancel_reentrant_put_impl(ControlBlock *i_control_block)

{
  uintptr_t uVar1;
  uintptr_t uint_pointer;
  ControlBlock *i_dest;
  
  i_dest = i_control_block + 3;
  if ((i_control_block->m_next & 4) != 0) {
    i_dest = (ControlBlock *)i_dest->m_next;
  }
  detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::destroy
            ((FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *)
             (i_control_block + 1),i_dest);
  uVar1 = i_control_block->m_next;
  if (((uint)uVar1 & 3) != 1) {
    density_tests::detail::assert_failed<>
              ("(i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == detail::Queue_Busy"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xb49);
    uVar1 = i_control_block->m_next;
  }
  i_control_block->m_next = uVar1 + 1;
  return;
}

Assistant:

DENSITY_NO_INLINE static void cancel_reentrant_put_impl(ControlBlock * i_control_block)
        {
            const auto type_ptr = type_after_control(i_control_block);
            type_ptr->destroy(get_element(i_control_block));

            type_ptr->RUNTIME_TYPE::~RUNTIME_TYPE();

            DENSITY_ASSERT_INTERNAL(
              (i_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
              detail::Queue_Busy);
            i_control_block->m_next += (detail::Queue_Dead - detail::Queue_Busy);
        }